

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLockLock::ArchiveIN(ChLinkLockLock *this,ChArchiveIn *marchive)

{
  AngleSet_mapper setmapper;
  ChEnumMapper<chrono::AngleSet> local_140;
  ChEnumMapper<chrono::AngleSet> local_120;
  ChNameValue<chrono::ChEnumMapper<chrono::AngleSet>_> local_100;
  ChNameValue<chrono::ChVector<double>_> local_e8;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_d0;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_b8;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_a0;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_88;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_70;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_58;
  ChNameValue<double> local_40;
  
  ChArchiveIn::VersionRead<chrono::ChLinkLockLock>(marchive);
  ChLinkMarkers::ArchiveIN((ChLinkMarkers *)this,marchive);
  local_40._value = &(this->super_ChLinkLock).d_restlength;
  local_40._name = "d_restlength";
  local_40._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_40);
  local_58._value = &this->motion_X;
  local_58._name = "motion_X";
  local_58._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_58);
  local_70._value = &this->motion_Y;
  local_70._name = "motion_Y";
  local_70._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_70);
  local_88._value = &this->motion_Z;
  local_88._name = "motion_Z";
  local_88._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_88);
  local_a0._value = &this->motion_ang;
  local_a0._name = "motion_ang";
  local_a0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_a0);
  local_b8._value = &this->motion_ang2;
  local_b8._name = "motion_ang2";
  local_b8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_b8);
  local_d0._value = &this->motion_ang3;
  local_d0._name = "motion_ang3";
  local_d0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_d0);
  local_e8._value = &this->motion_axis;
  local_e8._name = "motion_axis";
  local_e8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_e8);
  my_enum_mappers_angles::AngleSet_mapper::AngleSet_mapper((AngleSet_mapper *)&local_120);
  my_enum_mappers_angles::AngleSet_mapper::operator()
            (&local_140,(AngleSet_mapper *)&local_120,&this->angleset);
  local_100._name = "angle_set";
  local_100._flags = '\0';
  local_100._value = &local_140;
  ChArchiveIn::operator>>(marchive,&local_100);
  ChEnumMapper<chrono::AngleSet>::~ChEnumMapper(&local_140);
  ChEnumMapper<chrono::AngleSet>::~ChEnumMapper(&local_120);
  return;
}

Assistant:

void ChLinkLockLock::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkLockLock>();

    // deserialize parent class
    ChLinkMarkers::ArchiveIN(marchive);

    // deserialize all member data
    ////if (mask) delete (mask); marchive >> CHNVP(mask); //// TODO: needed?

    marchive >> CHNVP(d_restlength);

    ////marchive >> CHNVP(force_D);
    ////marchive >> CHNVP(force_R);
    ////marchive >> CHNVP(force_X);
    ////marchive >> CHNVP(force_Y);
    ////marchive >> CHNVP(force_Z);
    ////marchive >> CHNVP(force_Rx);
    ////marchive >> CHNVP(force_Ry);
    ////marchive >> CHNVP(force_Rz);

    ////marchive >> CHNVP(limit_X);
    ////marchive >> CHNVP(limit_Y);
    ////marchive >> CHNVP(limit_Z);
    ////marchive >> CHNVP(limit_Rx);
    ////marchive >> CHNVP(limit_Ry);
    ////marchive >> CHNVP(limit_Rz);
    ////marchive >> CHNVP(limit_Rp);
    ////marchive >> CHNVP(limit_D);

    marchive >> CHNVP(motion_X);
    marchive >> CHNVP(motion_Y);
    marchive >> CHNVP(motion_Z);
    marchive >> CHNVP(motion_ang);
    marchive >> CHNVP(motion_ang2);
    marchive >> CHNVP(motion_ang3);
    marchive >> CHNVP(motion_axis);

    my_enum_mappers_angles::AngleSet_mapper setmapper;
    marchive >> CHNVP(setmapper(angleset), "angle_set");
}